

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

long search::go(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  reference pMVar6;
  ostream *poVar7;
  reference this;
  long extraout_RAX;
  SearchInfo *in_RSI;
  Board *in_RDI;
  string local_f8;
  string local_d8;
  Move local_b8;
  Move move;
  iterator __end2;
  iterator __begin2;
  vector<board::Move,_std::allocator<board::Move>_> *__range2;
  int local_80;
  int depth;
  undefined1 local_70 [8];
  vector<board::Move,_std::allocator<board::Move>_> pv;
  PVTable pvtable;
  int score;
  SearchInfo *info_local;
  Board *pos_local;
  
  PVTable::PVTable((PVTable *)
                   &pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<board::Move,_std::allocator<board::Move>_>::vector
            ((vector<board::Move,_std::allocator<board::Move>_> *)local_70);
  reset(in_RDI,in_RSI);
  local_80 = 1;
  while( true ) {
    iVar2 = SearchInfo::getDepth(in_RSI);
    iVar3 = local_80;
    bVar1 = true;
    if (iVar2 != -1) {
      iVar2 = SearchInfo::getDepth(in_RSI);
      bVar1 = iVar3 <= iVar2;
    }
    if (!bVar1) break;
    iVar3 = negamax(-0x7fffffff,0x7ffffffe,local_80,in_RDI,in_RSI,
                    (PVTable *)
                    &pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    bVar1 = SearchInfo::getStopped(in_RSI);
    if (bVar1) break;
    PVTable::getPV((vector<board::Move,_std::allocator<board::Move>_> *)&__range2,
                   (PVTable *)
                   &pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,in_RDI);
    std::vector<board::Move,_std::allocator<board::Move>_>::operator=
              ((vector<board::Move,_std::allocator<board::Move>_> *)local_70,
               (vector<board::Move,_std::allocator<board::Move>_> *)&__range2);
    std::vector<board::Move,_std::allocator<board::Move>_>::~vector
              ((vector<board::Move,_std::allocator<board::Move>_> *)&__range2);
    poVar7 = std::operator<<((ostream *)&std::cout,"info score cp ");
    std::ostream::operator<<(poVar7,iVar3);
    poVar7 = std::operator<<((ostream *)&std::cout," depth ");
    std::ostream::operator<<(poVar7,local_80);
    poVar7 = std::operator<<((ostream *)&std::cout," nodes ");
    iVar4 = SearchInfo::getNodes(in_RSI);
    std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<((ostream *)&std::cout," time ");
    iVar4 = utils::getTime();
    iVar5 = SearchInfo::getStartTime(in_RSI);
    std::ostream::operator<<(poVar7,iVar4 - iVar5);
    std::operator<<((ostream *)&std::cout," pv");
    __end2 = std::vector<board::Move,_std::allocator<board::Move>_>::begin
                       ((vector<board::Move,_std::allocator<board::Move>_> *)local_70);
    move = (Move)std::vector<board::Move,_std::allocator<board::Move>_>::end
                           ((vector<board::Move,_std::allocator<board::Move>_> *)local_70);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
                                       *)&move), bVar1) {
      pMVar6 = __gnu_cxx::
               __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
               ::operator*(&__end2);
      local_b8 = *pMVar6;
      poVar7 = std::operator<<((ostream *)&std::cout," ");
      board::Move::getString_abi_cxx11_(&local_d8,&local_b8);
      std::operator<<(poVar7,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      __gnu_cxx::
      __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>::
      operator++(&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_80 = local_80 + 1;
  }
  bVar1 = std::vector<board::Move,_std::allocator<board::Move>_>::empty
                    ((vector<board::Move,_std::allocator<board::Move>_> *)local_70);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,"bestmove ");
    this = std::vector<board::Move,_std::allocator<board::Move>_>::operator[]
                     ((vector<board::Move,_std::allocator<board::Move>_> *)local_70,0);
    board::Move::getString_abi_cxx11_(&local_f8,this);
    poVar7 = std::operator<<(poVar7,(string *)&local_f8);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::vector<board::Move,_std::allocator<board::Move>_>::~vector
            ((vector<board::Move,_std::allocator<board::Move>_> *)local_70);
  PVTable::~PVTable((PVTable *)
                    &pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  return extraout_RAX;
}

Assistant:

void search::go(board::Board& pos, SearchInfo& info)
{
    int score = NEG_INFINITY;
    PVTable pvtable;
    std::vector<board::Move> pv;
    reset(pos, info);
    for (int depth = 1; info.getDepth() == -1 || depth <= info.getDepth(); depth++) {
        score = negamax(NEG_INFINITY, POS_INFINITY, depth, pos, info, pvtable);
        if (info.getStopped()) {
            break;
        }
        pv = pvtable.getPV(pos);
        std::cout << "info score cp " << score;
        std::cout << " depth " << depth;
        std::cout << " nodes " << info.getNodes();
        std::cout << " time " << (utils::getTime() - info.getStartTime());
        std::cout << " pv";
        for (board::Move move : pv) {
            std::cout << " " << move.getString();
        }
        std::cout << std::endl;
    }
    if (!pv.empty()) {
        std::cout << "bestmove " << pv[0].getString() << std::endl;
    }
}